

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O1

void __thiscall ICM::Compiler::IdentifierAnalysis::start(IdentifierAnalysis *this)

{
  Node *node;
  
  if (PrintCompilingProcess == '\x01') {
    printf("%s","IdentifierAnalysis");
    putchar(10);
  }
  node = AnalysisBase::GetNode(&this->super_AnalysisBase,1);
  setIdentSub(this,node);
  if (PrintCompilingProcess == '\x01') {
    printf("%s","-->");
    putchar(10);
    AnalysisBase::printTable(&this->super_AnalysisBase);
    return;
  }
  return;
}

Assistant:

void start() {
				if (PrintCompilingProcess)
					println("IdentifierAnalysis");

				setIdentSub(GetNode(1));

				if (PrintCompilingProcess) {
					println("-->");
					printTable();
				}
			}